

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O3

void noise_regular(void)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  char buf [512];
  rusage rusage;
  undefined1 auStack_2a8 [520];
  rusage local_a0;
  
  iVar1 = open("/proc/meminfo",0);
  if (-1 < iVar1) {
    sVar3 = read(iVar1,auStack_2a8,0x200);
    iVar2 = (int)sVar3;
    while (0 < iVar2) {
      random_add_noise(NOISE_SOURCE_MEMINFO,auStack_2a8,(int)sVar3);
      sVar3 = read(iVar1,auStack_2a8,0x200);
      iVar2 = (int)sVar3;
    }
    close(iVar1);
  }
  iVar1 = open("/proc/stat",0);
  if (-1 < iVar1) {
    sVar3 = read(iVar1,auStack_2a8,0x200);
    iVar2 = (int)sVar3;
    while (0 < iVar2) {
      random_add_noise(NOISE_SOURCE_STAT,auStack_2a8,(int)sVar3);
      sVar3 = read(iVar1,auStack_2a8,0x200);
      iVar2 = (int)sVar3;
    }
    close(iVar1);
  }
  getrusage(RUSAGE_SELF,&local_a0);
  random_add_noise(NOISE_SOURCE_RUSAGE,&local_a0,0x90);
  return;
}

Assistant:

void noise_regular(void)
{
    int fd;
    int ret;
    char buf[512];
    struct rusage rusage;

    if ((fd = open("/proc/meminfo", O_RDONLY)) >= 0) {
        while ( (ret = read(fd, buf, sizeof(buf))) > 0)
            random_add_noise(NOISE_SOURCE_MEMINFO, buf, ret);
        close(fd);
    }
    if ((fd = open("/proc/stat", O_RDONLY)) >= 0) {
        while ( (ret = read(fd, buf, sizeof(buf))) > 0)
            random_add_noise(NOISE_SOURCE_STAT, buf, ret);
        close(fd);
    }
    getrusage(RUSAGE_SELF, &rusage);
    random_add_noise(NOISE_SOURCE_RUSAGE, &rusage, sizeof(rusage));
}